

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O0

void __thiscall sptk::reaper::EpochTracker::CleanUp(EpochTracker *this)

{
  size_type sVar1;
  reference pvVar2;
  reference ppEVar3;
  long in_RDI;
  size_t j;
  size_t i;
  ulong local_18;
  ulong local_10;
  
  local_10 = 0;
  while( true ) {
    sVar1 = std::
            vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
            ::size((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                    *)(in_RDI + 8));
    if (sVar1 <= local_10) break;
    local_18 = 0;
    while( true ) {
      pvVar2 = std::
               vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
               ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                             *)(in_RDI + 8),local_10);
      sVar1 = std::
              vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
              ::size(&pvVar2->future);
      if (sVar1 <= local_18) break;
      pvVar2 = std::
               vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
               ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                             *)(in_RDI + 8),local_10);
      ppEVar3 = std::
                vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                ::operator[](&pvVar2->future,local_18);
      if (*ppEVar3 != (value_type)0x0) {
        operator_delete(*ppEVar3);
      }
      local_18 = local_18 + 1;
    }
    local_10 = local_10 + 1;
  }
  std::
  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
  ::clear((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
           *)0x11e576);
  std::
  vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
  ::clear((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
           *)0x11e584);
  std::vector<float,_std::allocator<float>_>::clear
            ((vector<float,_std::allocator<float>_> *)0x11e595);
  return;
}

Assistant:

void EpochTracker::CleanUp(void) {
  for (size_t i = 0; i < resid_peaks_.size(); ++i) {
    for (size_t j = 0; j < resid_peaks_[i].future.size(); ++j) {
      delete resid_peaks_[i].future[j];
    }
  }
  resid_peaks_.clear();
  output_.clear();
  best_corr_.clear();
}